

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StopRecordingRequest.h
# Opt level: O0

StopRecordingRequest * __thiscall
io::aeron::archive::codecs::StopRecordingRequest::putChannel(StopRecordingRequest *this,string *str)

{
  char *pcVar1;
  undefined4 uVar2;
  ulong uVar3;
  runtime_error *this_00;
  uint64_t uVar4;
  long lVar5;
  void *__src;
  size_t __n;
  uint64_t pos;
  uint32_t lengthFieldValue;
  uint64_t lengthPosition;
  uint64_t lengthOfLengthField;
  string *str_local;
  StopRecordingRequest *this_local;
  
  uVar3 = std::__cxx11::string::length();
  if (0x40000000 < uVar3) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"std::string too long for length type [E109]");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar4 = sbePosition(this);
  uVar2 = std::__cxx11::string::length();
  sbePosition(this,uVar4 + 4);
  *(undefined4 *)(this->m_buffer + uVar4) = uVar2;
  uVar4 = sbePosition(this);
  lVar5 = std::__cxx11::string::length();
  sbePosition(this,uVar4 + lVar5);
  pcVar1 = this->m_buffer;
  __src = (void *)std::__cxx11::string::c_str();
  __n = std::__cxx11::string::length();
  memcpy(pcVar1 + uVar4,__src,__n);
  return this;
}

Assistant:

StopRecordingRequest &putChannel(const std::string& str)
    {
        if (str.length() > 1073741824)
        {
             throw std::runtime_error("std::string too long for length type [E109]");
        }
        std::uint64_t lengthOfLengthField = 4;
        std::uint64_t lengthPosition = sbePosition();
        std::uint32_t lengthFieldValue = SBE_LITTLE_ENDIAN_ENCODE_32(static_cast<std::uint32_t>(str.length()));
        sbePosition(lengthPosition + lengthOfLengthField);
        std::memcpy(m_buffer + lengthPosition, &lengthFieldValue, sizeof(std::uint32_t));
        std::uint64_t pos = sbePosition();
        sbePosition(pos + str.length());
        std::memcpy(m_buffer + pos, str.c_str(), str.length());
        return *this;
    }